

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.cpp
# Opt level: O1

void __thiscall LiteScript::Namer::Namer(Namer *this,Namer *n)

{
  bool bVar1;
  
  Variable::Variable(&this->global,&n->global);
  bVar1 = (n->current).is_null;
  (this->current).is_null = bVar1;
  (this->current).isNull = &(this->current).is_null;
  if (bVar1 == false) {
    Variable::Variable((Variable *)&this->current,(Variable *)&n->current);
  }
  std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::vector
            (&this->heap,&n->heap);
  return;
}

Assistant:

LiteScript::Namer::Namer(const Namer &n) :
    global(n.global), current(n.current), heap(n.heap) {}